

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::TexelBufferComputeInstance::TexelBufferComputeInstance
          (TexelBufferComputeInstance *this,Context *context,DescriptorUpdateMethod updateMethod,
          VkDescriptorType descriptorType,ShaderInputInterface shaderInterface,
          bool nonzeroViewOffset)

{
  VkDescriptorType descriptorType_00;
  deUint32 dVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  VkQueue pVVar4;
  Allocator *pAVar5;
  bool nonzeroViewOffset_local;
  ShaderInputInterface shaderInterface_local;
  VkDescriptorType descriptorType_local;
  DescriptorUpdateMethod updateMethod_local;
  Context *context_local;
  TexelBufferComputeInstance *this_local;
  
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__TexelBufferComputeInstance_016a70c0;
  this->m_updateMethod = updateMethod;
  this->m_descriptorType = descriptorType;
  this->m_shaderInterface = shaderInterface;
  this->m_nonzeroViewOffset = nonzeroViewOffset;
  pDVar2 = Context::getDeviceInterface(context);
  this->m_vki = pDVar2;
  pVVar3 = Context::getDevice(context);
  this->m_device = pVVar3;
  pVVar4 = Context::getUniversalQueue(context);
  this->m_queue = pVVar4;
  dVar1 = Context::getUniversalQueueFamilyIndex(context);
  this->m_queueFamilyIndex = dVar1;
  pAVar5 = Context::getDefaultAllocator(context);
  this->m_allocator = pAVar5;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)32>_>::Move(&this->m_updateTemplate);
  ComputeInstanceResultBuffer::ComputeInstanceResultBuffer
            (&this->m_result,this->m_vki,this->m_device,this->m_allocator);
  pDVar2 = this->m_vki;
  pVVar3 = this->m_device;
  pAVar5 = this->m_allocator;
  descriptorType_00 = this->m_descriptorType;
  dVar1 = getInterfaceNumResources(this->m_shaderInterface);
  TexelBufferInstanceBuffers::TexelBufferInstanceBuffers
            (&this->m_texelBuffers,pDVar2,pVVar3,pAVar5,descriptorType_00,dVar1,
             (bool)(this->m_nonzeroViewOffset & 1));
  RawUpdateRegistry::RawUpdateRegistry(&this->m_updateRegistry);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&this->m_updateBuilder);
  return;
}

Assistant:

TexelBufferComputeInstance::TexelBufferComputeInstance (Context&					context,
														DescriptorUpdateMethod		updateMethod,
														vk::VkDescriptorType		descriptorType,
														ShaderInputInterface		shaderInterface,
														bool						nonzeroViewOffset)
	: vkt::TestInstance		(context)
	, m_updateMethod		(updateMethod)
	, m_descriptorType		(descriptorType)
	, m_shaderInterface		(shaderInterface)
	, m_nonzeroViewOffset	(nonzeroViewOffset)
	, m_vki					(context.getDeviceInterface())
	, m_device				(context.getDevice())
	, m_queue				(context.getUniversalQueue())
	, m_queueFamilyIndex	(context.getUniversalQueueFamilyIndex())
	, m_allocator			(context.getDefaultAllocator())
	, m_updateTemplate		()
	, m_result				(m_vki, m_device, m_allocator)
	, m_texelBuffers		(m_vki, m_device, m_allocator, m_descriptorType, getInterfaceNumResources(m_shaderInterface), m_nonzeroViewOffset)
	, m_updateRegistry		()
	, m_updateBuilder		()
{
}